

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doh.c
# Opt level: O0

void doh_show(Curl_easy *data,dohentry *d)

{
  int iVar1;
  dohaddr *pdVar2;
  size_t sVar3;
  char *pcVar4;
  size_t l;
  size_t len;
  char *ptr;
  char buffer [128];
  int local_2c;
  int j;
  dohaddr *a;
  int i;
  dohentry *d_local;
  Curl_easy *data_local;
  
  if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0)) &&
     (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) {
    Curl_infof(data,"[DoH] TTL: %u seconds",(ulong)d->ttl);
  }
  for (a._4_4_ = 0; a._4_4_ < d->numaddr; a._4_4_ = a._4_4_ + 1) {
    pdVar2 = d->addr + a._4_4_;
    if (pdVar2->type == 1) {
      if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0)) &&
         (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) {
        Curl_infof(data,"[DoH] A: %u.%u.%u.%u",(ulong)(pdVar2->ip).v4[0],(ulong)(pdVar2->ip).v4[1],
                   (ulong)(pdVar2->ip).v4[2],(ulong)(pdVar2->ip).v4[3]);
      }
    }
    else if (pdVar2->type == 0x1c) {
      iVar1 = curl_msnprintf((char *)&ptr,0x80,"[DoH] AAAA: ");
      len = (size_t)(buffer + (long)iVar1 + -8);
      l = 0x80 - (long)iVar1;
      for (local_2c = 0; local_2c < 0x10; local_2c = local_2c + 2) {
        pcVar4 = "";
        if (local_2c != 0) {
          pcVar4 = ":";
        }
        curl_msnprintf((char *)len,l,"%s%02x%02x",pcVar4,(ulong)d->addr[a._4_4_].ip.v4[local_2c],
                       (ulong)d->addr[a._4_4_].ip.v4[local_2c + 1]);
        sVar3 = strlen((char *)len);
        l = l - sVar3;
        len = sVar3 + len;
      }
      if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0)) &&
         (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) {
        Curl_infof(data,"%s",&ptr);
      }
    }
  }
  for (a._4_4_ = 0; a._4_4_ < d->numcname; a._4_4_ = a._4_4_ + 1) {
    if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0)) &&
       (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) {
      pcVar4 = Curl_dyn_ptr(d->cname + a._4_4_);
      Curl_infof(data,"CNAME: %s",pcVar4);
    }
  }
  return;
}

Assistant:

static void doh_show(struct Curl_easy *data,
                     const struct dohentry *d)
{
  int i;
  infof(data, "[DoH] TTL: %u seconds", d->ttl);
  for(i = 0; i < d->numaddr; i++) {
    const struct dohaddr *a = &d->addr[i];
    if(a->type == DNS_TYPE_A) {
      infof(data, "[DoH] A: %u.%u.%u.%u",
            a->ip.v4[0], a->ip.v4[1],
            a->ip.v4[2], a->ip.v4[3]);
    }
    else if(a->type == DNS_TYPE_AAAA) {
      int j;
      char buffer[128];
      char *ptr;
      size_t len;
      len = msnprintf(buffer, 128, "[DoH] AAAA: ");
      ptr = &buffer[len];
      len = sizeof(buffer) - len;
      for(j = 0; j < 16; j += 2) {
        size_t l;
        msnprintf(ptr, len, "%s%02x%02x", j?":":"", d->addr[i].ip.v6[j],
                  d->addr[i].ip.v6[j + 1]);
        l = strlen(ptr);
        len -= l;
        ptr += l;
      }
      infof(data, "%s", buffer);
    }
  }
#ifdef USE_HTTPSRR
  for(i = 0; i < d->numhttps_rrs; i++) {
# ifdef DEBUGBUILD
    doh_print_buf(data, "DoH HTTPS",
                  d->https_rrs[i].val, d->https_rrs[i].len);
# else
    infof(data, "DoH HTTPS RR: length %d", d->https_rrs[i].len);
# endif
  }
#endif
  for(i = 0; i < d->numcname; i++) {
    infof(data, "CNAME: %s", Curl_dyn_ptr(&d->cname[i]));
  }
}